

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,
          vector<double,_std::allocator<double>_> *target,string_view name,string_view value)

{
  bool bVar1;
  double *__x;
  optional<double> oVar2;
  _Storage<double,_true> local_48;
  optional<double> result;
  vector<double,_std::allocator<double>_> *target_local;
  Option *this_local;
  string_view name_local;
  string *error;
  
  result.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _15_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  oVar2 = parseDouble(name,value,__return_storage_ptr__);
  result.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload._0_1_ =
       oVar2.super__Optional_base<double,_true,_true>._M_payload.
       super__Optional_payload_base<double>._M_engaged;
  local_48 = oVar2.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_48);
  if (bVar1) {
    __x = std::optional<double>::operator*((optional<double> *)&local_48);
    std::vector<double,_std::allocator<double>_>::push_back(target,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::vector<double>& target, string_view name,
                                     string_view value) {
    std::string error;
    auto result = parseDouble(name, value, error);
    if (result)
        target.push_back(*result);
    return error;
}